

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O3

int lj_cf_jit_util_tracek(lua_State *L)

{
  TValue *pTVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  IRIns *ir;
  
  uVar2 = lj_lib_checkint(L,1);
  if ((uVar2 == 0) || (uVar4 = (ulong)(L->glref).ptr32, *(uint *)(uVar4 + 0x2d4) <= uVar2)) {
    lj_lib_checkint(L,2);
    iVar3 = 0;
  }
  else {
    uVar4 = (ulong)*(uint *)(*(long *)(uVar4 + 0x2c8) + (ulong)uVar2 * 4);
    uVar2 = lj_lib_checkint(L,2);
    iVar3 = 0;
    if (((uVar4 != 0) && (0xffff7fff < uVar2)) && (*(uint *)(uVar4 + 0x18) <= uVar2 + 0x8000)) {
      ir = (IRIns *)(*(long *)(uVar4 + 0x10) + (ulong)(uVar2 + 0x8000) * 8);
      uVar2 = 0xffffffff;
      if ((ir->field_1).o == '\x1d') {
        uVar2 = (uint)(ir->field_0).op2;
        ir = (IRIns *)(*(long *)(uVar4 + 0x10) + (ulong)(ir->field_0).op1 * 8);
      }
      lj_ir_kvalue(L,L->top + -2,ir);
      L->top[-1].n = (double)((ir->field_1).t.irt & 0x1f);
      if (uVar2 == 0xffffffff) {
        iVar3 = 2;
      }
      else {
        pTVar1 = L->top;
        L->top = pTVar1 + 1;
        pTVar1->n = (double)(int)uVar2;
        iVar3 = 3;
      }
    }
  }
  return iVar3;
}

Assistant:

LJLIB_CF(jit_util_tracek)
{
  GCtrace *T = jit_checktrace(L);
  IRRef ref = (IRRef)lj_lib_checkint(L, 2) + REF_BIAS;
  if (T && ref >= T->nk && ref < REF_BIAS) {
    IRIns *ir = &T->ir[ref];
    int32_t slot = -1;
    if (ir->o == IR_KSLOT) {
      slot = ir->op2;
      ir = &T->ir[ir->op1];
    }
    lj_ir_kvalue(L, L->top-2, ir);
    setintV(L->top-1, (int32_t)irt_type(ir->t));
    if (slot == -1)
      return 2;
    setintV(L->top++, slot);
    return 3;
  }
  return 0;
}